

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSDPResultData.c
# Opt level: O1

int SSDPResultData_assign(SSDPResultData *p,SSDPResultData *q)

{
  int iVar1;
  
  if (p != q) {
    iVar1 = SSDPResultData_set_Param(p,q->m_Param);
    if (iVar1 != 0) {
      p->m_Cookie = q->m_Cookie;
      p->m_CtrlptCallback = q->m_CtrlptCallback;
    }
    return iVar1;
  }
  return 1;
}

Assistant:

int SSDPResultData_assign(SSDPResultData *p, const SSDPResultData *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     SSDPResultData_set_Param(p, SSDPResultData_get_Param(q));
		ok = ok &&
		     SSDPResultData_set_Cookie(p, SSDPResultData_get_Cookie(q));
		ok = ok && SSDPResultData_set_CtrlptCallback(
				   p, SSDPResultData_get_CtrlptCallback(q));
	}

	return ok;
}